

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigCanon.c
# Opt level: O0

void Aig_RManRecord(uint *pTruth,int nVarsInit)

{
  uint nVars_00;
  int iVar1;
  uint uVar2;
  int iVar3;
  Kit_DsdNtk_t *pNtk_00;
  Kit_DsdObj_t *pObj_00;
  uint *__dest;
  uint *__src;
  int fUniqueVars;
  int nWords;
  int nVars;
  int i;
  uint uPhaseC;
  Kit_DsdObj_t *pObj;
  Kit_DsdNtk_t *pNtk;
  int fVerify;
  int nVarsInit_local;
  uint *pTruth_local;
  
  if (nVarsInit < 0xd) {
    if (s_pRMan == (Aig_RMan_t *)0x0) {
      s_pRMan = Aig_RManStart();
    }
    s_pRMan->nTotal = s_pRMan->nTotal + 1;
    pNtk_00 = Kit_DsdDecompose(pTruth,nVarsInit);
    pObj_00 = Kit_DsdNonDsdPrimeMax(pNtk_00);
    if ((pObj_00 == (Kit_DsdObj_t *)0x0) || ((uint)*pObj_00 >> 0x1a == 3)) {
      s_pRMan->nTtDsd = s_pRMan->nTtDsd + 1;
      Kit_DsdNtkFree(pNtk_00);
    }
    else {
      nVars_00 = (uint)*pObj_00 >> 0x1a;
      s_pRMan->nVarFuncs[(int)nVars_00] = s_pRMan->nVarFuncs[(int)nVars_00] + 1;
      if ((int)nVars_00 < nVarsInit) {
        s_pRMan->nTtDsdPart = s_pRMan->nTtDsdPart + 1;
      }
      else {
        s_pRMan->nTtDsdNot = s_pRMan->nTtDsdNot + 1;
      }
      iVar1 = Abc_TruthWordNum(nVars_00);
      __dest = s_pRMan->pTruthInit;
      __src = Kit_DsdObjTruth(pObj_00);
      memcpy(__dest,__src,(long)(iVar1 << 2));
      Kit_DsdNtkFree(pNtk_00);
      if ((s_pRMan->pTruthInit[0] & 1) != 0) {
        Kit_TruthNot(s_pRMan->pTruthInit,s_pRMan->pTruthInit,nVars_00);
      }
      memcpy(s_pRMan->pTruth,s_pRMan->pTruthInit,(long)(iVar1 << 2));
      for (nWords = 0; nWords < (int)nVars_00; nWords = nWords + 1) {
        s_pRMan->pPerm[nWords] = (char)nWords;
      }
      uVar2 = Aig_RManSemiCanonicize
                        (s_pRMan->pTruthTemp,s_pRMan->pTruth,nVars_00,s_pRMan->pPerm,s_pRMan->pMints
                         ,1);
      iVar1 = Aig_RManVarsAreUnique(s_pRMan->pMints,nVars_00);
      s_pRMan->nUniqueVars = iVar1 + s_pRMan->nUniqueVars;
      iVar3 = Aig_RManTableFindOrAdd(s_pRMan,s_pRMan->pTruth,nVars_00);
      if (iVar3 != 0) {
        Aig_RManSaveOne(s_pRMan,s_pRMan->pTruth,nVars_00);
      }
      for (nWords = 0; nWords < (int)nVars_00; nWords = nWords + 1) {
        s_pRMan->pPermR[nWords] = s_pRMan->pPerm[nWords];
      }
      Kit_TruthPermute(s_pRMan->pTruthTemp,s_pRMan->pTruth,nVars_00,s_pRMan->pPermR,1);
      for (nWords = 0; nWords < (int)nVars_00; nWords = nWords + 1) {
        if ((uVar2 & 1 << ((byte)nWords & 0x1f)) != 0) {
          Kit_TruthChangePhase(s_pRMan->pTruth,nVars_00,nWords);
        }
      }
      if ((iVar1 != 0) &&
         (iVar1 = Kit_TruthIsEqual(s_pRMan->pTruth,s_pRMan->pTruthInit,nVars_00), iVar1 == 0)) {
        printf("Verification failed.\n");
      }
    }
  }
  else {
    printf("The number of variables in too large.\n");
  }
  return;
}

Assistant:

void Aig_RManRecord( unsigned * pTruth, int nVarsInit )
{
    int fVerify = 1;
    Kit_DsdNtk_t * pNtk;
    Kit_DsdObj_t * pObj;
    unsigned uPhaseC;
    int i, nVars, nWords;
    int fUniqueVars;

    if ( nVarsInit > RMAN_MAXVARS )
    {
        printf( "The number of variables in too large.\n" );
        return;
    }

    if ( s_pRMan == NULL )
        s_pRMan = Aig_RManStart();
    s_pRMan->nTotal++;
    // canonicize the function
    pNtk = Kit_DsdDecompose( pTruth, nVarsInit );
    pObj = Kit_DsdNonDsdPrimeMax( pNtk );
    if ( pObj == NULL || pObj->nFans == 3 )
    {
        s_pRMan->nTtDsd++;
        Kit_DsdNtkFree( pNtk );
        return;
    }
    nVars = pObj->nFans;
    s_pRMan->nVarFuncs[nVars]++;
    if ( nVars < nVarsInit )
        s_pRMan->nTtDsdPart++;
    else
        s_pRMan->nTtDsdNot++;
    // compute the number of words
    nWords = Abc_TruthWordNum( nVars );
    // copy the function
    memcpy( s_pRMan->pTruthInit, Kit_DsdObjTruth(pObj), (size_t)(4*nWords) );
    Kit_DsdNtkFree( pNtk );
    // canonicize the output
    if ( s_pRMan->pTruthInit[0] & 1 )
        Kit_TruthNot( s_pRMan->pTruthInit, s_pRMan->pTruthInit, nVars );
    memcpy( s_pRMan->pTruth, s_pRMan->pTruthInit, 4*nWords );

    // canonize the function
    for ( i = 0; i < nVars; i++ )
        s_pRMan->pPerm[i] = i;
    uPhaseC = Aig_RManSemiCanonicize( s_pRMan->pTruthTemp, s_pRMan->pTruth, nVars, s_pRMan->pPerm, s_pRMan->pMints, 1 );
    // check unique variables
    fUniqueVars = Aig_RManVarsAreUnique( s_pRMan->pMints, nVars );
    s_pRMan->nUniqueVars += fUniqueVars;

/*
    printf( "%4d : ", s_pRMan->nTotal );
    printf( "%2d %2d  ", nVarsInit, nVars );
    Extra_PrintBinary( stdout, &uPhaseC, nVars );
    printf( "  " );
    for ( i = 0; i < nVars; i++ )
        printf( "%2d/%2d ", s_pRMan->pMints[2*i], s_pRMan->pMints[2*i+1] );
    printf( "\n" );
    Aig_RManPrintUniqueVars( s_pRMan->pMints, nVars );
Extra_PrintBinary( stdout, s_pRMan->pTruth, 1<<nVars ); printf( "\n\n" );
*/
/*
    printf( "\n" );
    printf( "%4d : ", s_pRMan->nTotal );
    printf( "%2d %2d  ", nVarsInit, nVars );
    printf( "   " );
    printf( "\n" );
    Aig_RManPrintUniqueVars( s_pRMan->pMints, nVars );
//    Aig_RManPrintSigs( s_pRMan->pMints, nVars );
*/

//Extra_PrintBinary( stdout, s_pRMan->pTruth, 1<<nVars ); printf( "\n\n" );

    if ( Aig_RManTableFindOrAdd( s_pRMan, s_pRMan->pTruth, nVars ) )
        Aig_RManSaveOne( s_pRMan, s_pRMan->pTruth, nVars );

    if ( fVerify )
    {
        // derive reverse permutation
        for ( i = 0; i < nVars; i++ )
            s_pRMan->pPermR[i] = s_pRMan->pPerm[i];
        // implement permutation
        Kit_TruthPermute( s_pRMan->pTruthTemp, s_pRMan->pTruth, nVars, s_pRMan->pPermR, 1 );
        // implement polarity
        for ( i = 0; i < nVars; i++ )
            if ( uPhaseC & (1 << i) )
                Kit_TruthChangePhase( s_pRMan->pTruth, nVars, i );

        // perform verification
        if ( fUniqueVars && !Kit_TruthIsEqual( s_pRMan->pTruth, s_pRMan->pTruthInit, nVars ) )
            printf( "Verification failed.\n" );
    }
//Aig_RManPrintVarProfile( s_pRMan->pTruth, nVars, s_pRMan->pTruthTemp );
//Extra_PrintBinary( stdout, s_pRMan->pTruth, 1<<nVars ); printf( "\n" );
}